

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

mat<4UL,_4UL> * __thiscall
mat<4UL,_4UL>::adjugate(mat<4UL,_4UL> *__return_storage_ptr__,mat<4UL,_4UL> *this)

{
  vec<4UL,_double> *this_00;
  double *pdVar1;
  size_t row;
  size_t col;
  double dVar2;
  undefined8 local_20;
  size_t j;
  size_t i;
  mat<4UL,_4UL> *this_local;
  
  mat(__return_storage_ptr__);
  j = 4;
  while (row = j - 1, j != 0) {
    local_20 = 4;
    while (col = local_20 - 1, j = row, local_20 != 0) {
      dVar2 = cofactor(this,row,col);
      this_00 = operator[](__return_storage_ptr__,row);
      pdVar1 = vec<4UL,_double>::operator[](this_00,col);
      *pdVar1 = dVar2;
      local_20 = col;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

mat<nrows, ncols> adjugate() const
    {
        mat<nrows, ncols> ret;
        for (size_t i = nrows; i--;)
            for (size_t j = ncols; j--; ret[i][j] = cofactor(i, j))
                ;
        return ret;
    }